

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O0

void __thiscall fasttext::DenseMatrix::uniform(DenseMatrix *this,real a,uint thread,int32_t seed)

{
  ulong uVar1;
  size_type sVar2;
  undefined4 in_EDX;
  uint in_ESI;
  vector<std::thread,_std::allocator<std::thread>_> *in_RDI;
  int32_t i_1;
  int i;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  value_type *in_stack_ffffffffffffff88;
  int local_68;
  vector<std::thread,_std::allocator<std::thread>_> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int32_t in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  real in_stack_ffffffffffffffcc;
  uint uVar3;
  DenseMatrix *in_stack_ffffffffffffffd0;
  
  if (in_ESI < 2) {
    uniformThread(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                  in_stack_ffffffffffffffc4);
  }
  else {
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)0x1c4a16);
    for (uVar3 = 0; uVar3 < in_ESI; uVar3 = uVar3 + 1) {
      std::thread::thread<fasttext::DenseMatrix::uniform(float,unsigned_int,int)::__0,,void>
                ((thread *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (type *)CONCAT44(in_stack_ffffffffffffffbc,in_EDX));
      std::vector<std::thread,_std::allocator<std::thread>_>::push_back
                (in_RDI,in_stack_ffffffffffffff88);
      std::thread::~thread((thread *)0x1c4a7e);
    }
    local_68 = 0;
    while( true ) {
      uVar1 = (ulong)local_68;
      sVar2 = std::vector<std::thread,_std::allocator<std::thread>_>::size
                        ((vector<std::thread,_std::allocator<std::thread>_> *)
                         &stack0xffffffffffffffd0);
      if (sVar2 <= uVar1) break;
      std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                ((vector<std::thread,_std::allocator<std::thread>_> *)&stack0xffffffffffffffd0,
                 (long)local_68);
      std::thread::join();
      local_68 = local_68 + 1;
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

void DenseMatrix::uniform(real a, unsigned int thread, int32_t seed) {
  if (thread > 1) {
    std::vector<std::thread> threads;
    for (int i = 0; i < thread; i++) {
      threads.push_back(std::thread([=]() { uniformThread(a, i, seed); }));
    }
    for (int32_t i = 0; i < threads.size(); i++) {
      threads[i].join();
    }
  } else {
    // webassembly can't instantiate `std::thread`
    uniformThread(a, 0, seed);
  }
}